

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

int test_ints(void)

{
  int iVar1;
  ptrdiff_t pVar2;
  int64_t iVar3;
  char *pcVar4;
  char *d1_1;
  char *d1;
  char *d2;
  char *d4;
  char *d3;
  
  _plan(0xa2,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_ints");
  buf[1] = -1;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x01",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 2);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check_int(-0x01) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -1),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x01)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_decode(mp_encode(-0x01)) == -0x01");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 1);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_check(-0x01)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_encode_int(-0x01)");
  _ok((uint)(d2 == buf + 2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_decode_int(-0x01))");
  _ok((uint)(d3 == buf + 2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_next_int(-0x01))");
  _ok((uint)(d4 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "len(mp_check_int(-0x01))");
  _ok(1,"mp_sizeof_int(-0x01) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_sizeof_int(-0x01)");
  _ok((uint)(buf[1] == -1),"memcmp(data, (\"\\xff\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x104,
      "mp_encode(-0x01) == \"\\xff\"");
  buf[1] = -0x1e;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x1e",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 2);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check_int(-0x1e) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x1e),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1e)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_decode(mp_encode(-0x1e)) == -0x1e");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 1);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_check(-0x1e)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_encode_int(-0x1e)");
  _ok((uint)(d2 == buf + 2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_decode_int(-0x1e))");
  _ok((uint)(d3 == buf + 2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_next_int(-0x1e))");
  _ok((uint)(d4 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "len(mp_check_int(-0x1e))");
  _ok(1,"mp_sizeof_int(-0x1e) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_sizeof_int(-0x1e)");
  _ok((uint)(buf[1] == -0x1e),"memcmp(data, (\"\\xe2\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x105,
      "mp_encode(-0x1e) == \"\\xe2\"");
  buf[1] = -0x1f;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x1f",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 2);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check_int(-0x1f) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x1f),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x1f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_decode(mp_encode(-0x1f)) == -0x1f");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 1);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_check(-0x1f)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_encode_int(-0x1f)");
  _ok((uint)(d2 == buf + 2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_decode_int(-0x1f))");
  _ok((uint)(d3 == buf + 2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_next_int(-0x1f))");
  _ok((uint)(d4 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "len(mp_check_int(-0x1f))");
  _ok(1,"mp_sizeof_int(-0x1f) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_sizeof_int(-0x1f)");
  _ok((uint)(buf[1] == -0x1f),"memcmp(data, (\"\\xe1\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x106,
      "mp_encode(-0x1f) == \"\\xe1\"");
  buf[1] = -0x20;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x20",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 2);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check_int(-0x20) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x20),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x20)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_decode(mp_encode(-0x20)) == -0x20");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 1);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_check(-0x20)");
  _ok(1,"(d1 - data) == (1)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_encode_int(-0x20)");
  _ok((uint)(d2 == buf + 2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_decode_int(-0x20))");
  _ok((uint)(d3 == buf + 2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_next_int(-0x20))");
  _ok((uint)(d4 == buf + 2),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "len(mp_check_int(-0x20))");
  _ok(1,"mp_sizeof_int(-0x20) == 1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_sizeof_int(-0x20)");
  _ok((uint)(buf[1] == -0x20),"memcmp(data, (\"\\xe0\"), (1)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x107,
      "mp_encode(-0x20) == \"\\xe0\"");
  buf[1] = -0x30;
  buf[2] = -0x21;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x21",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 3);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check_int(-0x21) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x21),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x21)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_decode(mp_encode(-0x21)) == -0x21");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 2);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_check(-0x21)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_encode_int(-0x21)");
  _ok((uint)(d2 == buf + 3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_decode_int(-0x21))");
  _ok((uint)(d3 == buf + 3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_next_int(-0x21))");
  _ok((uint)(d4 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "len(mp_check_int(-0x21))");
  _ok(1,"mp_sizeof_int(-0x21) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_sizeof_int(-0x21)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x2030),"memcmp(data, (\"\\xd0\\xdf\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x108,
      "mp_encode(-0x21) == \"\\xd0\\xdf\"");
  buf[1] = -0x30;
  buf[2] = -0x7f;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7f",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 3);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check_int(-0x7f) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x7f),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_decode(mp_encode(-0x7f)) == -0x7f");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 2);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_check(-0x7f)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_encode_int(-0x7f)");
  _ok((uint)(d2 == buf + 3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_decode_int(-0x7f))");
  _ok((uint)(d3 == buf + 3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_next_int(-0x7f))");
  _ok((uint)(d4 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "len(mp_check_int(-0x7f))");
  _ok(1,"mp_sizeof_int(-0x7f) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_sizeof_int(-0x7f)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x7e30),"memcmp(data, (\"\\xd0\\x81\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10a,
      "mp_encode(-0x7f) == \"\\xd0\\x81\"");
  buf[1] = -0x30;
  buf[2] = -0x80;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 3);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check_int(-0x80) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x80),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_decode(mp_encode(-0x80)) == -0x80");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 2);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_check(-0x80)");
  _ok(1,"(d1 - data) == (2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_encode_int(-0x80)");
  _ok((uint)(d2 == buf + 3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_decode_int(-0x80))");
  _ok((uint)(d3 == buf + 3),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_next_int(-0x80))");
  _ok((uint)(d4 == buf + 3),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "len(mp_check_int(-0x80))");
  _ok(1,"mp_sizeof_int(-0x80) == 2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_sizeof_int(-0x80)");
  _ok((uint)(CONCAT11(buf[2],buf[1]) == -0x7f30),"memcmp(data, (\"\\xd0\\x80\"), (2)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10b,
      "mp_encode(-0x80) == \"\\xd0\\x80\"");
  buf[1] = -0x2f;
  buf[2] = -1;
  buf[3] = '\x7f';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x81",9,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 4);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check_int(-0x81) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x81),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x81)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_decode(mp_encode(-0x81)) == -0x81");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 3);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_check(-0x81)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_encode_int(-0x81)");
  _ok((uint)(d2 == buf + 4),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_decode_int(-0x81))");
  _ok((uint)(d3 == buf + 4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_next_int(-0x81))");
  _ok((uint)(d4 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "len(mp_check_int(-0x81))");
  _ok(1,"mp_sizeof_int(-0x81) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_sizeof_int(-0x81)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_22ae,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\xff\\x7f\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10d,
      "mp_encode(-0x81) == \"\\xd1\\xff\\x7f\"");
  buf[1] = -0x2f;
  buf[2] = -0x80;
  buf[3] = '\x01';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7fff",0xb,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 4);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check_int(-0x7fff) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x7fff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_decode(mp_encode(-0x7fff)) == -0x7fff");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 3);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_check(-0x7fff)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_encode_int(-0x7fff)");
  _ok((uint)(d2 == buf + 4),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_decode_int(-0x7fff))");
  _ok((uint)(d3 == buf + 4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_next_int(-0x7fff))");
  _ok((uint)(d4 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "len(mp_check_int(-0x7fff))");
  _ok(1,"mp_sizeof_int(-0x7fff) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_sizeof_int(-0x7fff)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_2362,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\x80\\x01\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10e,
      "mp_encode(-0x7fff) == \"\\xd1\\x80\\x01\"");
  buf[1] = -0x2f;
  buf[2] = -0x80;
  buf[3] = '\0';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x8000",0xb,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 4);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check_int(-0x8000) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x8000),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8000)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_decode(mp_encode(-0x8000)) == -0x8000");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 3);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_check(-0x8000)");
  _ok(1,"(d1 - data) == (3)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_encode_int(-0x8000)");
  _ok((uint)(d2 == buf + 4),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_decode_int(-0x8000))");
  _ok((uint)(d3 == buf + 4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_next_int(-0x8000))");
  _ok((uint)(d4 == buf + 4),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "len(mp_check_int(-0x8000))");
  _ok(1,"mp_sizeof_int(-0x8000) == 3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_sizeof_int(-0x8000)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_240a,3);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd1\\x80\\x00\"), (3)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x10f,
      "mp_encode(-0x8000) == \"\\xd1\\x80\\x00\"");
  buf[1] = -0x2e;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = '\x7f';
  buf[5] = -1;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x8001",0xb,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 6);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check_int(-0x8001) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x8001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x8001)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_decode(mp_encode(-0x8001)) == -0x8001");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 5);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_check(-0x8001)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_encode_int(-0x8001)");
  _ok((uint)(d2 == buf + 6),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_decode_int(-0x8001))");
  _ok((uint)(d3 == buf + 6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_next_int(-0x8001))");
  _ok((uint)(d4 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "len(mp_check_int(-0x8001))");
  _ok(1,"mp_sizeof_int(-0x8001) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_sizeof_int(-0x8001)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_24b2,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\xff\\xff\\x7f\\xff\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x111,
      "mp_encode(-0x8001) == \"\\xd2\\xff\\xff\\x7f\\xff\"");
  buf[1] = -0x2e;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\x01';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7fffffff",0xf,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 6);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check_int(-0x7fffffff) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x7fffffff),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffff)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_decode(mp_encode(-0x7fffffff)) == -0x7fffffff");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 5);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_check(-0x7fffffff)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_encode_int(-0x7fffffff)");
  _ok((uint)(d2 == buf + 6),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_decode_int(-0x7fffffff))");
  _ok((uint)(d3 == buf + 6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_next_int(-0x7fffffff))");
  _ok((uint)(d4 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "len(mp_check_int(-0x7fffffff))");
  _ok(1,"mp_sizeof_int(-0x7fffffff) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_sizeof_int(-0x7fffffff)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_2566,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x01\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x112,
      "mp_encode(-0x7fffffff) == \"\\xd2\\x80\\x00\\x00\\x01\"");
  buf[1] = -0x2e;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80000000LL",0x11,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 6);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check_int(-0x80000000LL) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x80000000),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000000LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_decode(mp_encode(-0x80000000LL)) == -0x80000000LL");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 5);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_check(-0x80000000LL)");
  _ok(1,"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_encode_int(-0x80000000LL)");
  _ok((uint)(d2 == buf + 6),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_decode_int(-0x80000000LL))");
  _ok((uint)(d3 == buf + 6),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_next_int(-0x80000000LL))");
  _ok((uint)(d4 == buf + 6),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "len(mp_check_int(-0x80000000LL))");
  _ok(1,"mp_sizeof_int(-0x80000000LL) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_sizeof_int(-0x80000000LL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_261a,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x113,
      "mp_encode(-0x80000000LL) == \"\\xd2\\x80\\x00\\x00\\x00\"");
  buf[1] = -0x2d;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = -1;
  buf[5] = -1;
  buf[6] = '\x7f';
  buf[7] = -1;
  buf[8] = -1;
  buf[9] = -1;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80000001LL",0x11,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 10);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_check_int(-0x80000001LL) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x80000001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 9);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_check(-0x80000001LL)");
  _ok(1,"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_encode_int(-0x80000001LL)");
  _ok((uint)(d2 == buf + 10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_decode_int(-0x80000001LL))");
  _ok((uint)(d3 == buf + 10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_next_int(-0x80000001LL))");
  _ok((uint)(d4 == buf + 10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "len(mp_check_int(-0x80000001LL))");
  _ok(1,"mp_sizeof_int(-0x80000001LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_sizeof_int(-0x80000001LL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_26ce,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x116,
      "mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
  buf[1] = -0x2d;
  buf[2] = -1;
  buf[3] = -1;
  buf[4] = -1;
  buf[5] = -1;
  buf[6] = '\x7f';
  buf[7] = -1;
  buf[8] = -1;
  buf[9] = -1;
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x80000001LL",0x11,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 10);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_check_int(-0x80000001LL) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x80000001),"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x80000001LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_decode(mp_encode(-0x80000001LL)) == -0x80000001LL");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 9);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_check(-0x80000001LL)");
  _ok(1,"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_encode_int(-0x80000001LL)");
  _ok((uint)(d2 == buf + 10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_decode_int(-0x80000001LL))");
  _ok((uint)(d3 == buf + 10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_next_int(-0x80000001LL))");
  _ok((uint)(d4 == buf + 10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "len(mp_check_int(-0x80000001LL))");
  _ok(1,"mp_sizeof_int(-0x80000001LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_sizeof_int(-0x80000001LL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_26ce,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x118,
      "mp_encode(-0x80000001LL) == \"\\xd3\\xff\\xff\\xff\\xff\\x7f\\xff\\xff\\xff\"");
  buf[1] = -0x2d;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\x01';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int -0x7fffffffffffffffLL",0x19,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 10);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_check_int(-0x7fffffffffffffffLL) == 0");
  iVar3 = mp_decode_int(&d2);
  _ok((uint)(iVar3 == -0x7fffffffffffffff),
      "mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == (-0x7fffffffffffffffLL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_decode(mp_encode(-0x7fffffffffffffffLL)) == -0x7fffffffffffffffLL");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 9);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_check(-0x7fffffffffffffffLL)");
  _ok(1,"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_encode_int(-0x7fffffffffffffffLL)");
  _ok((uint)(d2 == buf + 10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_decode_int(-0x7fffffffffffffffLL))");
  _ok((uint)(d3 == buf + 10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_next_int(-0x7fffffffffffffffLL))");
  _ok((uint)(d4 == buf + 10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "len(mp_check_int(-0x7fffffffffffffffLL))");
  _ok(1,"mp_sizeof_int(-0x7fffffffffffffffLL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_sizeof_int(-0x7fffffffffffffffLL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_278e,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11a,
      "mp_encode(-0x7fffffffffffffffLL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x01\"");
  buf[1] = -0x2d;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  d2 = buf + 1;
  d3 = buf + 1;
  d4 = buf + 1;
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int (int64_t)-0x8000000000000000LL",0x22,1,_stdout);
  fputc(10,_stdout);
  pVar2 = mp_check_int(buf + 1,buf + 10);
  _ok((uint)(pVar2 == 0),"mp_check_int(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_check_int((int64_t)-0x8000000000000000LL) == 0");
  mp_decode_int(&d2);
  _ok(0,"mp_decode_int(&d2 COMPLEX(COMMA &ext_type)) == ((int64_t)-0x8000000000000000LL)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_decode(mp_encode((int64_t)-0x8000000000000000LL)) == (int64_t)-0x8000000000000000LL");
  mp_next(&d3);
  iVar1 = mp_check(&d4,d3 + 9);
  _ok((uint)(iVar1 == 0),"!mp_check(&d4, d3 + 9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_check((int64_t)-0x8000000000000000LL)");
  _ok(1,"(d1 - data) == (9)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_encode_int((int64_t)-0x8000000000000000LL)");
  _ok((uint)(d2 == buf + 10),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_decode_int((int64_t)-0x8000000000000000LL))");
  _ok((uint)(d3 == buf + 10),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_next_int((int64_t)-0x8000000000000000LL))");
  _ok((uint)(d4 == buf + 10),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "len(mp_check_int((int64_t)-0x8000000000000000LL))");
  _ok(1,"mp_sizeof_int((int64_t)-0x8000000000000000LL) == 9",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_sizeof_int((int64_t)-0x8000000000000000LL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_284e,9);
  _ok((uint)(iVar1 == 0),
      "memcmp(data, (\"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\"), (9)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11c,
      "mp_encode((int64_t)-0x8000000000000000LL) == \"\\xd3\\x80\\x00\\x00\\x00\\x00\\x00\\x00\\x00\""
     );
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fwrite("int_safe",8,1,_stdout);
  fputc(10,_stdout);
  d2 = (char *)0x0;
  pcVar4 = mp_encode_int_safe((char *)0x0,(ptrdiff_t *)&d2,-0x80000000);
  _ok((uint)(d2 == (char *)0xfffffffffffffffb),"-sz == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(NULL, &sz)");
  d2 = (char *)0x5;
  pcVar4 = mp_encode_int_safe(buf + 1,(ptrdiff_t *)&d2,-0x80000000);
  _ok((uint)(d2 == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(buf, &sz)");
  _ok((uint)(pcVar4 == buf + 6),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "len of mp_encode_int_safe(buf, &sz)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_261a,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, &sz)");
  d2 = (char *)0x4;
  pcVar4 = mp_encode_int_safe(buf + 1,(ptrdiff_t *)&d2,-0x80000000);
  _ok((uint)(d2 == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "size after mp_encode_int_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == buf + 1),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, &sz) overflow");
  buf[1] = -0x2e;
  buf[2] = -0x80;
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  _ok(1,"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "len of mp_encode_int_safe(buf, NULL)");
  iVar1 = bcmp(buf + 1,anon_var_dwarf_261a,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xd2\\x80\\x00\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x11e,
      "mp_encode_int_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_ints");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_ints(void)
{
	plan(17*9 + 9);
	header();

	test_int(-0x01, "\xff", 1);
	test_int(-0x1e, "\xe2", 1);
	test_int(-0x1f, "\xe1", 1);
	test_int(-0x20, "\xe0", 1);
	test_int(-0x21, "\xd0\xdf", 2);

	test_int(-0x7f, "\xd0\x81", 2);
	test_int(-0x80, "\xd0\x80", 2);

	test_int(-0x81, "\xd1\xff\x7f", 3);
	test_int(-0x7fff, "\xd1\x80\x01", 3);
	test_int(-0x8000, "\xd1\x80\x00", 3);

	test_int(-0x8001, "\xd2\xff\xff\x7f\xff", 5);
	test_int(-0x7fffffff, "\xd2\x80\x00\x00\x01", 5);
	test_int(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x80000001LL,
	     "\xd3\xff\xff\xff\xff\x7f\xff\xff\xff", 9);
	test_int(-0x7fffffffffffffffLL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x01", 9);
	test_int((int64_t)-0x8000000000000000LL,
	     "\xd3\x80\x00\x00\x00\x00\x00\x00\x00", 9);

	test_int_safe(-0x80000000LL, "\xd2\x80\x00\x00\x00", 5);

	footer();
	return check_plan();
}